

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

void __thiscall
gguf_writer::write_tensor_data
          (gguf_writer *this,gguf_tensor_info *info,size_t offset_data,size_t alignment)

{
  pointer pcVar1;
  pointer pcVar2;
  void *__src;
  _Bool _Var3;
  size_t __n;
  char *pcVar4;
  int line;
  
  if ((long)(this->buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)((this->buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_start + offset_data) == info->offset) {
    _Var3 = ggml_is_contiguous(&info->t);
    if (_Var3) {
      pcVar1 = (this->buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar2 = (this->buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __n = ggml_nbytes(&info->t);
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                (this->buf,(size_type)(pcVar1 + (__n - (long)pcVar2)));
      if ((info->t).buffer == (ggml_backend_buffer *)0x0) {
        __src = (info->t).data;
        if (__src == (void *)0x0) {
          pcVar4 = "info.t.data";
          line = 0x4e8;
          goto LAB_00141901;
        }
        memcpy(pcVar1 + ((long)(this->buf->
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                               _M_impl.super__Vector_impl_data._M_start - (long)pcVar2),__src,__n);
      }
      else {
        ggml_backend_tensor_get
                  (&info->t,pcVar1 + ((long)(this->buf->
                                            super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                            )._M_impl.super__Vector_impl_data._M_start -
                                     (long)pcVar2),0,__n);
      }
      pad(this,alignment);
      return;
    }
    pcVar4 = "ggml_is_contiguous(&info.t)";
    line = 0x4e0;
  }
  else {
    pcVar4 = "buf.size() - offset_data == info.offset";
    line = 0x4de;
  }
LAB_00141901:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

void write_tensor_data(const struct gguf_tensor_info & info, const size_t offset_data, const size_t alignment) const {
        GGML_ASSERT(buf.size() - offset_data == info.offset);

        GGML_ASSERT(ggml_is_contiguous(&info.t));
        const size_t offset = buf.size();
        const size_t nbytes = ggml_nbytes(&info.t);

        buf.resize(offset + nbytes);
        if (info.t.buffer) {
            ggml_backend_tensor_get(&info.t, buf.data() + offset, 0, nbytes);
        } else {
            GGML_ASSERT(info.t.data);
            memcpy(buf.data() + offset, info.t.data, nbytes);
        }

        pad(alignment);
    }